

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SignedText.cpp
# Opt level: O0

string * __thiscall
oout::SignedText::asString_abi_cxx11_(string *__return_storage_ptr__,SignedText *this)

{
  SignedText *this_local;
  
  std::__cxx11::to_string(__return_storage_ptr__,this->value);
  return __return_storage_ptr__;
}

Assistant:

string SignedText::asString() const
{
	return to_string(value);
}